

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::getsteinerptonsegment(tetgenmesh *this,face *seg,point refpt,point steinpt)

{
  double *pdVar1;
  double *pdVar2;
  double *p1;
  double *p2;
  verttype vVar3;
  int iVar4;
  point e1;
  point e2;
  shellface sptr;
  double dVar5;
  double dVar6;
  point far_ej;
  point far_ei;
  int sidx2;
  point far_pj;
  point far_pi;
  undefined1 local_68 [4];
  int sidx1;
  face parentseg;
  double t;
  double L1;
  double L;
  int i;
  int adjflag;
  point ej;
  point ei;
  point steinpt_local;
  point refpt_local;
  face *seg_local;
  tetgenmesh *this_local;
  
  e1 = sorg(this,seg);
  e2 = sdest(this,seg);
  L._4_4_ = 0;
  if (refpt == (point)0x0) {
    for (L._0_4_ = 0; L._0_4_ < 3; L._0_4_ = L._0_4_ + 1) {
      steinpt[L._0_4_] = (e2[L._0_4_] - e1[L._0_4_]) * 0.5 + e1[L._0_4_];
    }
  }
  else {
    vVar3 = pointtype(this,refpt);
    if (vVar3 == FREESEGVERTEX) {
      face::face((face *)local_68);
      sptr = point2sh(this,refpt);
      sdecode(this,sptr,(face *)local_68);
      iVar4 = getfacetindex(this,(face *)local_68);
      pdVar1 = this->segmentendpointslist[iVar4 << 1];
      pdVar2 = this->segmentendpointslist[iVar4 * 2 + 1];
      iVar4 = getfacetindex(this,seg);
      p1 = this->segmentendpointslist[iVar4 << 1];
      p2 = this->segmentendpointslist[iVar4 * 2 + 1];
      if ((pdVar1 == p1) || (pdVar2 == p1)) {
        dVar5 = distance(this,p1,p2);
        dVar6 = distance(this,p1,refpt);
        parentseg._8_8_ = dVar6 / dVar5;
        for (L._0_4_ = 0; L._0_4_ < 3; L._0_4_ = L._0_4_ + 1) {
          steinpt[L._0_4_] = (double)parentseg._8_8_ * (p2[L._0_4_] - p1[L._0_4_]) + p1[L._0_4_];
        }
        L._4_4_ = 1;
      }
      else if ((pdVar1 == p2) || (pdVar2 == p2)) {
        dVar5 = distance(this,p1,p2);
        dVar6 = distance(this,p2,refpt);
        parentseg._8_8_ = dVar6 / dVar5;
        for (L._0_4_ = 0; L._0_4_ < 3; L._0_4_ = L._0_4_ + 1) {
          steinpt[L._0_4_] = (double)parentseg._8_8_ * (p1[L._0_4_] - p2[L._0_4_]) + p2[L._0_4_];
        }
        L._4_4_ = 1;
      }
      else {
        projpt2edge(this,refpt,e1,e2,steinpt);
      }
    }
    else {
      projpt2edge(this,refpt,e1,e2,steinpt);
    }
    dVar5 = distance(this,e1,e2);
    dVar6 = distance(this,steinpt,e1);
    if ((dVar6 / dVar5 < 0.2) || (0.8 < dVar6 / dVar5)) {
      for (L._0_4_ = 0; L._0_4_ < 3; L._0_4_ = L._0_4_ + 1) {
        steinpt[L._0_4_] = (e2[L._0_4_] - e1[L._0_4_]) * 0.5 + e1[L._0_4_];
      }
    }
  }
  return L._4_4_;
}

Assistant:

int tetgenmesh::getsteinerptonsegment(face* seg, point refpt, point steinpt)
{
  point ei = sorg(*seg);
  point ej = sdest(*seg);
  int adjflag = 0, i;

  if (refpt != NULL) {
    REAL L, L1, t;
  
    if (pointtype(refpt) == FREESEGVERTEX) {
      face parentseg;
      sdecode(point2sh(refpt), parentseg);
      int sidx1 = getfacetindex(parentseg);
      point far_pi = segmentendpointslist[sidx1 * 2];
      point far_pj = segmentendpointslist[sidx1 * 2 + 1];
      int sidx2 = getfacetindex(*seg);
      point far_ei = segmentendpointslist[sidx2 * 2];
      point far_ej = segmentendpointslist[sidx2 * 2 + 1];
      if ((far_pi == far_ei) || (far_pj == far_ei)) {
        // Create a Steiner point at the intersection of the segment
        //   [far_ei, far_ej] and the sphere centered at far_ei with 
        //   radius |far_ei - refpt|.
        L = distance(far_ei, far_ej);
        L1 = distance(far_ei, refpt);
        t = L1 / L;
        for (i = 0; i < 3; i++) {
          steinpt[i] = far_ei[i] + t * (far_ej[i] - far_ei[i]);
        }
        adjflag = 1;
      } else if ((far_pi == far_ej) || (far_pj == far_ej)) {
        L = distance(far_ei, far_ej);
        L1 = distance(far_ej, refpt);
        t = L1 / L;
        for (i = 0; i < 3; i++) {
          steinpt[i] = far_ej[i] + t * (far_ei[i] - far_ej[i]);
        }
        adjflag = 1;
      } else {
        // Cut the segment by the projection point of refpt.
        projpt2edge(refpt, ei, ej, steinpt);
      }
    } else {
      // Cut the segment by the projection point of refpt.
      projpt2edge(refpt, ei, ej, steinpt);
    }

    // Make sure that steinpt is not too close to ei and ej.
    L = distance(ei, ej);
    L1 = distance(steinpt, ei);
    t = L1 / L;
    if ((t < 0.2) || (t > 0.8)) {
      // Split the point at the middle.
      for (i = 0; i < 3; i++) {
        steinpt[i] = ei[i] + 0.5 * (ej[i] - ei[i]);
      }
    }
  } else {
    // Split the point at the middle.
    for (i = 0; i < 3; i++) {
      steinpt[i] = ei[i] + 0.5 * (ej[i] - ei[i]);
    }
  }


  return adjflag;
}